

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

wchar_t monster_critical(random_value dice,wchar_t rlev,wchar_t dam)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  
  wVar1 = randcalc(dice,rlev,MAXIMISE);
  if (dam < (wVar1 * 0x13) / 0x14) {
    return L'\0';
  }
  if (dam < L'\x14') {
    wVar2 = Rand_div(100);
    if (dam <= wVar2) {
      return L'\0';
    }
    wVar1 = (wchar_t)(wVar1 == dam);
  }
  else {
    wVar1 = (uint)(wVar1 == dam) + L'\x03';
    do {
      wVar2 = wVar1;
      uVar3 = Rand_div(100);
      wVar1 = wVar2 + L'\x01';
    } while ((int)uVar3 < 2);
    if (L'-' < dam) goto LAB_0016582d;
    if (L'!' < dam) goto LAB_00165832;
    if (L'\x19' < dam) {
      return wVar1;
    }
    wVar1 = wVar2 + L'\xfffffffd';
  }
  if (L'\x12' < dam) {
    return wVar1 + L'\x03';
  }
  if (dam < L'\f') {
LAB_00165832:
    return wVar1 + L'\x01';
  }
LAB_0016582d:
  return wVar1 + L'\x02';
}

Assistant:

static int monster_critical(random_value dice, int rlev, int dam)
{
	int max = 0;
	int total = randcalc(dice, rlev, MAXIMISE);

	/* Must do at least 95% of perfect */
	if (dam < total * 19 / 20) return (0);

	/* Weak blows rarely work */
	if ((dam < 20) && (randint0(100) >= dam)) return (0);

	/* Perfect damage */
	if (dam == total) max++;

	/* Super-charge */
	if (dam >= 20)
		while (randint0(100) < 2) max++;

	/* Critical damage */
	if (dam > 45) return (6 + max);
	if (dam > 33) return (5 + max);
	if (dam > 25) return (4 + max);
	if (dam > 18) return (3 + max);
	if (dam > 11) return (2 + max);
	return (1 + max);
}